

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-list.c
# Opt level: O1

void test_qlist_iterate(void)

{
  uint cond;
  undefined4 *puVar1;
  int iVar2;
  undefined8 ****ppppuVar3;
  QLIST list;
  undefined8 ***local_40;
  undefined8 ***local_38;
  
  local_40 = &local_40;
  local_38 = &local_40;
  puVar1 = (undefined4 *)malloc(0x10);
  acutest_check_((uint)(puVar1 != (undefined4 *)0x0),
                 "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-list.c"
                 ,0x112,"%s","d != NULL");
  *puVar1 = 1;
  *(undefined8 *****)(puVar1 + 2) = &local_40;
  *local_38 = (undefined8 **)(puVar1 + 2);
  local_38 = (undefined8 ***)(puVar1 + 2);
  puVar1 = (undefined4 *)malloc(0x10);
  acutest_check_((uint)(puVar1 != (undefined4 *)0x0),
                 "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-list.c"
                 ,0x112,"%s","d != NULL");
  *puVar1 = 2;
  *(undefined8 *****)(puVar1 + 2) = &local_40;
  *local_38 = (undefined8 **)(puVar1 + 2);
  local_38 = (undefined8 ***)(puVar1 + 2);
  puVar1 = (undefined4 *)malloc(0x10);
  acutest_check_((uint)(puVar1 != (undefined4 *)0x0),
                 "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-list.c"
                 ,0x112,"%s","d != NULL");
  *puVar1 = 3;
  *(undefined8 *****)(puVar1 + 2) = &local_40;
  ppppuVar3 = (undefined8 ****)(puVar1 + 2);
  *local_38 = ppppuVar3;
  local_38 = ppppuVar3;
  if ((undefined8 ****)local_40 != &local_40) {
    iVar2 = 1;
    ppppuVar3 = (undefined8 ****)local_40;
    do {
      acutest_check_((uint)(iVar2 == *(int *)(ppppuVar3 + -1)),
                     "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-list.c"
                     ,0x136,"%s","data->value == n");
      iVar2 = iVar2 + 1;
      ppppuVar3 = (undefined8 ****)*ppppuVar3;
    } while (ppppuVar3 != &local_40);
  }
  cond = 0;
  if ((undefined8 ****)local_40 != &local_40) {
    iVar2 = 3;
    do {
      if (local_38 == local_40) {
        local_38 = &local_40;
      }
      ppppuVar3 = (undefined8 ****)local_40 + -1;
      local_40 = (undefined8 ***)*local_40;
      free(ppppuVar3);
      iVar2 = iVar2 + -1;
    } while ((undefined8 ****)local_40 != &local_40);
    cond = (uint)(iVar2 == 0);
  }
  acutest_check_(cond,
                 "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-list.c"
                 ,0x141,"%s","n == 3");
  return;
}

Assistant:

static void
test_qlist_iterate(void)
{
    QLIST list;
    QLIST_NODE* node;
    QDATA* data;
    int n;

    /* Create simple list. */
    qlist_init(&list);
    qlist_append(&list, &alloc_qdata(1)->list_node);
    qlist_append(&list, &alloc_qdata(2)->list_node);
    qlist_append(&list, &alloc_qdata(3)->list_node);

    /* Iterate forward. */
    for(node = qlist_head(&list), n = 1; node != qlist_end(&list); node = qlist_next(node), n++) {
        data = QLIST_DATA(node, QDATA, list_node);
        TEST_CHECK(data->value == n);
    }

    /* Clean up. */
    n = 0;
    while(!qlist_is_empty(&list)) {
        node = qlist_head(&list);
        qlist_remove_head(&list);
        free(QLIST_DATA(node, QDATA, list_node));
        n++;
    }
    TEST_CHECK(n == 3);
}